

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

Vec_Int_t * Mop_ManFindDist1Pairs(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  long lVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  iVar18 = vGroup->nSize;
  if (0 < iVar18) {
    lVar19 = 1;
    lVar13 = 0;
    do {
      iVar2 = vGroup->pArray[lVar13];
      uVar6 = p->nWordsIn * iVar2;
      if (((int)uVar6 < 0) || (p->vWordsIn->nSize <= (int)uVar6)) {
LAB_00335181:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar1 = lVar13 + 1;
      lVar12 = (long)iVar18;
      if (lVar1 < lVar12) {
        pwVar3 = p->vWordsIn->pArray;
        lVar12 = lVar19;
        do {
          uVar10 = p->nWordsIn;
          uVar11 = uVar10 * vGroup->pArray[lVar12];
          if (((int)uVar11 < 0) || (p->vWordsIn->nSize <= (int)uVar11)) goto LAB_00335181;
          if (0 < (int)uVar10) {
            bVar5 = true;
            uVar15 = 0;
            do {
              while( true ) {
                uVar14 = uVar15 + 1;
                uVar17 = pwVar3[uVar6 + uVar15];
                uVar16 = p->vWordsIn->pArray[uVar11 + uVar15];
                uVar15 = uVar14;
                if (uVar17 != uVar16) break;
                if (uVar14 == uVar10) {
                  if (bVar5) goto LAB_00335148;
                  goto LAB_003350cc;
                }
              }
              uVar16 = uVar16 ^ uVar17;
              if (((((uVar16 >> 1 ^ uVar16) & 0x5555555555555555) != 0) ||
                  (uVar17 = uVar16 & 0x5555555555555555 & uVar16 >> 1, (bool)~bVar5 || uVar17 == 0))
                 || (uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333),
                    1 < (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38))) goto LAB_00335148;
              bVar5 = false;
            } while (uVar14 != uVar10);
LAB_003350cc:
            iVar8 = p->nWordsOut;
            uVar10 = iVar8 * iVar2;
            if ((int)uVar10 < 0) goto LAB_00335181;
            uVar11 = p->vWordsOut->nSize;
            if ((((int)uVar11 <= (int)uVar10) ||
                (uVar7 = vGroup->pArray[lVar12] * iVar8, (int)uVar7 < 0)) || (uVar11 <= uVar7))
            goto LAB_00335181;
            pwVar4 = p->vWordsOut->pArray;
            iVar8 = bcmp(pwVar4 + uVar10,pwVar4 + uVar7,(long)iVar8 << 3);
            if (iVar8 == 0) {
              Vec_IntPush(p_00,(int)lVar13);
              Vec_IntPush(p_00,(int)lVar12);
              iVar18 = vGroup->nSize;
            }
          }
LAB_00335148:
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 < iVar18);
        lVar12 = (long)iVar18;
      }
      lVar19 = lVar19 + 1;
      lVar13 = lVar1;
    } while (lVar1 < lVar12);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManFindDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int c1, c2, iCube1, iCube2;
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            if ( !memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) )
                Vec_IntPushTwo( vPairs, c1, c2 );
        }
    }
    return vPairs;
}